

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hud.cpp
# Opt level: O0

void __thiscall CHud::RenderDeadNotification(CHud *this)

{
  int iVar1;
  CTextCursor *this_00;
  ITextRender *pIVar2;
  long in_RDI;
  CTextCursor *unaff_retaddr;
  char *pText;
  CTextCursor *in_stack_ffffffffffffffe0;
  char *in_stack_ffffffffffffffe8;
  char *in_stack_fffffffffffffff0;
  long lVar3;
  
  if ((((*(int *)(*(long *)(*(long *)(in_RDI + 8) + 0xdf8) + 4) == 0) &&
       (*(int *)(*(long *)(in_RDI + 8) + 0x1b140) != -1)) &&
      (*(int *)(*(long *)(in_RDI + 8) + (long)*(int *)(*(long *)(in_RDI + 8) + 0x1b140) * 0x5b0 +
               0x4848) != -1)) &&
     ((*(long *)(*(long *)(in_RDI + 8) + 0xdd0) != 0 &&
      ((**(uint **)(*(long *)(in_RDI + 8) + 0xdd0) & 0x10) != 0)))) {
    if (RenderDeadNotification()::s_Cursor == '\0') {
      lVar3 = in_RDI;
      iVar1 = __cxa_guard_acquire(&RenderDeadNotification()::s_Cursor);
      if (iVar1 != 0) {
        CTextCursor::CTextCursor(unaff_retaddr,(float)((ulong)lVar3 >> 0x20),(int)lVar3);
        __cxa_atexit(CTextCursor::~CTextCursor,&RenderDeadNotification::s_Cursor,&__dso_handle);
        __cxa_guard_release(&RenderDeadNotification()::s_Cursor);
      }
    }
    CComponent::Graphics((CComponent *)0x164254);
    IGraphics::ScreenAspect((IGraphics *)in_stack_ffffffffffffffe0);
    CTextCursor::MoveTo(in_stack_ffffffffffffffe0,(float)((ulong)in_RDI >> 0x20),(float)in_RDI);
    RenderDeadNotification::s_Cursor.m_Align = 1;
    this_00 = (CTextCursor *)Localize(in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8);
    CLocalizationDatabase::Version(&g_Localization);
    CTextCursor::Reset(this_00,in_RDI);
    pIVar2 = CComponent::TextRender((CComponent *)0x1642c5);
    (*(pIVar2->super_IInterface)._vptr_IInterface[0xb])
              (pIVar2,&RenderDeadNotification::s_Cursor,this_00,0xffffffff);
  }
  return;
}

Assistant:

void CHud::RenderDeadNotification()
{
	if(m_pClient->m_Snap.m_pGameData->m_GameStateFlags == 0
		&& m_pClient->m_LocalClientID != -1
		&& m_pClient->m_aClients[m_pClient->m_LocalClientID].m_Team != TEAM_SPECTATORS
		&& m_pClient->m_Snap.m_pLocalInfo
		&& (m_pClient->m_Snap.m_pLocalInfo->m_PlayerFlags&PLAYERFLAG_DEAD))
	{
		static CTextCursor s_Cursor(16.0f);
		s_Cursor.MoveTo(150*Graphics()->ScreenAspect(), 50);
		s_Cursor.m_Align = TEXTALIGN_TC;

		const char *pText = Localize("Wait for next round");

		s_Cursor.Reset(g_Localization.Version());
		TextRender()->TextOutlined(&s_Cursor, pText, -1);
	}
}